

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::pack_A_tile_quantize(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000540;
  int in_stack_00000544;
  int in_stack_00000548;
  int in_stack_0000054c;
  Mat *in_stack_00000550;
  Mat *in_stack_00000558;
  
  pack_A_tile_fp32_to_int8
            (in_stack_00000558,in_stack_00000550,in_stack_0000054c,in_stack_00000548,
             in_stack_00000544,in_stack_00000540,(Mat *)CONCAT44(in_R8D,in_R9D));
  return;
}

Assistant:

static void pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}